

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

void __thiscall Memory::Write8(Memory *this,uint16_t addr,uint8_t value)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  undefined8 in_RCX;
  byte in_DL;
  ushort in_SI;
  Memory *in_RDI;
  uint16_t i;
  uint8_t *where;
  uint8_t in_stack_ffffffffffffffcd;
  uint16_t in_stack_ffffffffffffffce;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  undefined6 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe6;
  ushort uVar3;
  
  if (in_SI < 0x2000) {
    in_RDI->ram[(int)((uint)in_SI % 0x800)] = in_DL;
  }
  else if ((in_SI < 0x2000) || (0x3fff < in_SI)) {
    if ((in_SI < 0x4000) || (0x4017 < in_SI)) {
      if (((in_SI < 0x4018) || (0x401f < in_SI)) && (0x401f < in_SI)) {
        if ((in_SI < 0x6000) || (0x7fff < in_SI)) {
          ROM::Write((ROM *)CONCAT17(in_stack_ffffffffffffffd7,
                                     CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),
                     in_stack_ffffffffffffffce,in_stack_ffffffffffffffcd);
        }
        else {
          ROM::WriteSRAM(in_RDI->rom,in_SI + 0xa000,in_DL);
        }
      }
    }
    else if (in_SI == 0x4014) {
      puVar2 = PPU::getOAMRAM(in_RDI->ppu);
      for (uVar3 = 0; uVar3 < 0x100; uVar3 = uVar3 + 1) {
        uVar1 = Read8(in_RDI,CONCAT11(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd6));
        puVar2[uVar3] = uVar1;
      }
      in_RDI->addCyclesAfterDMA = 0x201;
    }
    else if (in_SI == 0x4016) {
      Controller::Write(in_RDI->controller,in_DL);
    }
    else if (in_SI != 0x4017) {
      APU::write(in_RDI->apu,(uint)in_SI,(void *)(ulong)in_DL,
                 CONCAT62((int6)((ulong)in_RCX >> 0x10),in_SI));
    }
  }
  else {
    PPU::Write((PPU *)CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0),
               (uint16_t)((ulong)in_RDI >> 0x30),(uint8_t)((ulong)in_RDI >> 0x28));
  }
  return;
}

Assistant:

void Memory::Write8(uint16_t addr, uint8_t value) {
    if (addr >= 0 && addr <= 0x1FFF) {
        ram[addr % 0x0800] = value;
    } else if (addr >= 0x2000 && addr <= 0x3FFF) {
        ppu->Write(addr % 8, value);
    } else if (addr >= 0x4000 && addr <= 0x4017) {
        if (addr == 0x4014) { // broken stuff
            uint8_t *where = ppu->getOAMRAM();
            for (uint16_t i = 0; i < 0x100; i++) {
                where[i] = Read8((value << 8) + i);
            }
            addCyclesAfterDMA = 513;
        } else if (addr == 0x4016) {
            controller->Write(value);
        } else if (addr == 0x4017) {
        	// TODO: not implemented
        } else {
        	apu->write(addr, value);
        }
    } else if (addr >= 0x4018 && addr <= 0x401F) {
        // I/O registers from test mode cpu
    } else if (addr >= 0x4020 && addr <= 0xFFFF) {
        if (addr >= 0x6000 && addr <= 0x7FFF) {
            rom->WriteSRAM(addr - 0x6000, value);
        } else {
            rom->Write(addr, value);
        }

    }
}